

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

BOOL __thiscall
Js::HeapArgumentsObject::SetProperty
          (HeapArgumentsObject *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  BOOL BVar1;
  int iVar2;
  undefined8 in_RAX;
  uint local_34 [2];
  uint32 index;
  
  local_34[0] = (uint)((ulong)in_RAX >> 0x20);
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr,propertyId,local_34);
  if (((BVar1 != 0) && (local_34[0] < (*(uint *)&this->field_0x20 & 0x7fffffff))) &&
     (iVar2 = (*(this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(this,(ulong)local_34[0],value), iVar2 != 0)) {
    return 1;
  }
  BVar1 = DynamicObject::SetProperty((DynamicObject *)this,propertyId,value,flags,info);
  return BVar1;
}

Assistant:

BOOL HeapArgumentsObject::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        // Try to set a numbered property that maps to an actual argument.
        ScriptContext *scriptContext = GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index) && index < this->HeapArgumentsObject::GetNumberOfArguments())
        {
            if (this->SetItemAt(index, value))
            {
                return true;
            }
        }

        // TODO: In strict mode, "callee" and "caller" cannot be set.

        // length is also set in the dynamic object
        return DynamicObject::SetProperty(propertyId, value, flags, info);
    }